

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

ItemFlags __thiscall QFileSystemModel::flags(QFileSystemModel *this,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  QFileSystemModelPrivate *node;
  QFileSystemModelPrivate *in_RSI;
  QFileSystemNode *in_RDI;
  long in_FS_OFFSET;
  QFileSystemNode *indexNode;
  QFileSystemModelPrivate *d;
  ItemFlags flags;
  undefined4 in_stack_ffffffffffffffb8;
  Permission in_stack_ffffffffffffffbc;
  QFileSystemModelPrivate *in_stack_ffffffffffffffc8;
  QFlagsStorageHelper<QFileDevice::Permission,_4> local_10;
  QFlagsStorage<Qt::ItemFlag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  node = d_func((QFileSystemModel *)0xaa63df);
  local_c.i = 0xaaaaaaaa;
  local_c.i = QAbstractItemModel::flags((QModelIndex *)in_RDI);
  bVar1 = QModelIndex::isValid((QModelIndex *)in_RDI);
  if (bVar1) {
    QFileSystemModelPrivate::node(in_stack_ffffffffffffffc8,(QModelIndex *)in_RDI);
    if (((node->nameFilterDisables & 1U) == 0) ||
       (bVar1 = QFileSystemModelPrivate::passNameFilters(in_RSI,(QFileSystemNode *)node), bVar1)) {
      QFlags<Qt::ItemFlag>::operator|=((QFlags<Qt::ItemFlag> *)&local_c,ItemIsDragEnabled);
      bVar1 = QFileSystemModelPrivate::QFileSystemNode::isDir
                        ((QFileSystemNode *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (!bVar1) {
        QFlags<Qt::ItemFlag>::operator|=((QFlags<Qt::ItemFlag> *)&local_c,ItemNeverHasChildren);
      }
      if ((node->readOnly & 1U) == 0) {
        iVar2 = QModelIndex::column((QModelIndex *)in_RSI);
        in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffffff;
        if (iVar2 == 0) {
          QFileSystemModelPrivate::QFileSystemNode::permissions(in_RDI);
          local_10.super_QFlagsStorage<QFileDevice::Permission>.i =
               (QFlagsStorage<QFileDevice::Permission>)
               QFlags<QFileDevice::Permission>::operator&
                         ((QFlags<QFileDevice::Permission> *)in_RDI,in_stack_ffffffffffffffbc);
          IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
          in_stack_ffffffffffffffbc = CONCAT13(IVar3 != 0,(int3)in_stack_ffffffffffffffbc);
        }
        if ((char)(in_stack_ffffffffffffffbc >> 0x18) != '\0') {
          QFlags<Qt::ItemFlag>::operator|=((QFlags<Qt::ItemFlag> *)&local_c,ItemIsEditable);
          bVar1 = QFileSystemModelPrivate::QFileSystemNode::isDir
                            ((QFileSystemNode *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
          if (bVar1) {
            QFlags<Qt::ItemFlag>::operator|=((QFlags<Qt::ItemFlag> *)&local_c,ItemIsDropEnabled);
          }
        }
      }
    }
    else {
      QFlags<Qt::ItemFlag>::operator&=((QFlags<Qt::ItemFlag> *)&local_c,-0x21);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<Qt::ItemFlag,_4>)(QFlagsStorageHelper<Qt::ItemFlag,_4>)local_c.i;
}

Assistant:

Qt::ItemFlags QFileSystemModel::flags(const QModelIndex &index) const
{
    Q_D(const QFileSystemModel);
    Qt::ItemFlags flags = QAbstractItemModel::flags(index);
    if (!index.isValid())
        return flags;

    QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(index);
    if (d->nameFilterDisables && !d->passNameFilters(indexNode)) {
        flags &= ~Qt::ItemIsEnabled;
        // ### TODO you shouldn't be able to set this as the current item, task 119433
        return flags;
    }

    flags |= Qt::ItemIsDragEnabled;

    if (!indexNode->isDir())
        flags |= Qt::ItemNeverHasChildren;
    if (d->readOnly)
        return flags;
    if ((index.column() == 0) && indexNode->permissions() & QFile::WriteUser) {
        flags |= Qt::ItemIsEditable;
        if (indexNode->isDir())
            flags |= Qt::ItemIsDropEnabled;
    }
    return flags;
}